

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

void ReadPCMComprTable(UINT32 dataSize,UINT8 *data,PCM_COMPR_TBL *comprTbl)

{
  byte bVar1;
  UINT16 UVar2;
  UINT8 *pUVar3;
  uint local_28;
  UINT32 tblSize;
  UINT8 valSize;
  PCM_COMPR_TBL *comprTbl_local;
  UINT8 *data_local;
  UINT32 dataSize_local;
  
  comprTbl->comprType = *data;
  comprTbl->cmpSubType = data[1];
  comprTbl->bitsDec = data[2];
  comprTbl->bitsCmp = data[3];
  UVar2 = ReadLE16(data + 4);
  comprTbl->valueCount = UVar2;
  bVar1 = (byte)((ulong)(comprTbl->bitsDec + 7) / 8);
  local_28 = (uint)comprTbl->valueCount * (uint)bVar1;
  if (dataSize < local_28 + 6) {
    local_28 = dataSize - 6;
    comprTbl->valueCount = (UINT16)(local_28 / bVar1);
  }
  pUVar3 = (UINT8 *)realloc((comprTbl->values).d8,(ulong)local_28);
  (comprTbl->values).d8 = pUVar3;
  if (bVar1 < 2) {
    memcpy((comprTbl->values).d8,data + 6,(ulong)local_28);
  }
  else {
    memcpy((comprTbl->values).d8,data + 6,(ulong)local_28);
  }
  return;
}

Assistant:

void ReadPCMComprTable(UINT32 dataSize, const UINT8* data, PCM_COMPR_TBL* comprTbl)
{
	UINT8 valSize;
	UINT32 tblSize;
	
	comprTbl->comprType = data[0x00];
	comprTbl->cmpSubType = data[0x01];
	comprTbl->bitsDec = data[0x02];
	comprTbl->bitsCmp = data[0x03];
	comprTbl->valueCount = ReadLE16(&data[0x04]);
	
	valSize = (comprTbl->bitsDec + 7) / 8;
	tblSize = comprTbl->valueCount * valSize;
	
	if (dataSize < 0x06 + tblSize)
	{
		//printf("Warning! Bad PCM Table Length!\n");
		tblSize = dataSize - 0x06;
		comprTbl->valueCount = tblSize / valSize;
	}
	
	comprTbl->values.d8 = (UINT8*)realloc(comprTbl->values.d8, tblSize);
	if (valSize < 0x02)
	{
		memcpy(comprTbl->values.d8, &data[0x06], tblSize);
	}
	else
	{
#ifndef VGM_LITTLE_ENDIAN
		UINT16 curVal;
		
		for (curVal = 0x00; curVal < comprTbl->valueCount; curVal ++)
			comprTbl->values.d16[curVal] = ReadLE16(&data[0x06 + curVal * 0x02]);
#else
		memcpy(comprTbl->values.d16, &data[0x06], tblSize);
#endif
	}
	
	return;
}